

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack32_8(uint32_t *in,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  
  uVar1 = *(undefined8 *)(in + 2);
  uVar2 = *(undefined8 *)(in + 4);
  uVar3 = *(undefined8 *)(in + 6);
  *(undefined8 *)out = *(undefined8 *)in;
  *(undefined8 *)(out + 2) = uVar1;
  *(undefined8 *)(out + 4) = uVar2;
  *(undefined8 *)(out + 6) = uVar3;
  return in + 8;
}

Assistant:

const uint32_t *__fastunpack32_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;
  *out = ((*in) >> 0);
  ++in;
  out++;

  return in;
}